

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O0

void * tc_valloc(size_t __size)

{
  int iVar1;
  void *p;
  size_t size_local;
  memalign_retry_data data;
  void *p_1;
  void *local_10;
  
  iVar1 = getpagesize();
  data._16_8_ = do_debug_memalign((long)iVar1,__size,-0x10325470);
  local_10 = (void *)data._16_8_;
  if ((void *)data._16_8_ == (void *)0x0) {
    data.size._0_4_ = 0xefcdab90;
    size_local = (long)iVar1;
    data.align = __size;
    local_10 = anon_unknown.dwarf_5601::handle_oom(retry_debug_memalign,&size_local,false,true);
  }
  tcmalloc::InvokeNewHook(local_10,__size);
  return local_10;
}

Assistant:

PERFTOOLS_DLL_DECL void* tc_valloc(size_t size) PERFTOOLS_NOTHROW {
  // Allocate >= size bytes starting on a page boundary
  void *p = do_debug_memalign_or_debug_cpp_memalign(getpagesize(), size, MallocBlock::kMallocType, false, true);
  tcmalloc::InvokeNewHook(p, size);
  return p;
}